

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QPoint *pos)

{
  uint uVar1;
  Operation OVar2;
  undefined4 uVar3;
  QWidget *this_00;
  long lVar4;
  undefined4 uVar6;
  QWidgetData *pQVar5;
  int iVar7;
  iterator iVar8;
  QSize QVar9;
  uint uVar10;
  uint extraout_EDX;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  iVar8 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                    (&this->operationMap,&this->currentOperation);
  uVar11 = *(uint *)((long)iVar8.i._M_node + 0x28);
  uVar16 = (pos->xp).m_i;
  iVar12 = (pos->yp).m_i;
  uVar1 = *(uint *)(*(long *)&this_00->field_0x8 + 0x388);
  uVar10 = ~uVar1;
  iVar14 = iVar12;
  if ((uVar10 & 3) == 0) goto LAB_0044ccb2;
  lVar4 = *(long *)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 0x20);
  uVar10 = *(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14);
  iVar7 = *(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18);
  OVar2 = this->currentOperation;
  if ((uVar1 & 2) == 0) {
    if ((byte)(OVar2 == Move | (byte)((uVar11 & 0x20) >> 5)) == 1) {
      iVar14 = (this->mousePressPosition).yp.m_i - (this->oldGeometry).y1.m_i;
      if (iVar14 <= iVar12) {
        iVar14 = iVar12;
      }
      iVar12 = iVar14;
      if (iVar7 + -4 <= iVar14) {
        iVar12 = iVar7 + -4;
      }
      goto LAB_0044cc29;
    }
  }
  else {
LAB_0044cc29:
    if (OVar2 == Move) {
      if ((uVar1 & 1) == 0) {
        uVar10 = uVar10 - 4;
        uVar13 = 5;
        if (5 < (int)uVar16) {
          uVar13 = uVar16;
        }
        uVar16 = uVar13;
        if ((int)uVar10 <= (int)uVar13) {
          uVar16 = uVar10;
        }
      }
      iVar14 = iVar12;
      if (((uVar1 & 2) == 0) && (iVar14 = iVar7 + -4, iVar12 < iVar7 + -4)) {
        iVar14 = iVar12;
      }
      goto LAB_0044ccb2;
    }
  }
  if ((uVar1 & 1) == 0) {
    if ((uVar11 & 0x10) == 0) {
      uVar10 = (uVar10 - (this->oldGeometry).x2.m_i) + (this->mousePressPosition).xp.m_i;
      if ((int)uVar10 < (int)uVar16) {
        uVar16 = uVar10;
      }
    }
    else {
      uVar10 = (this->mousePressPosition).xp.m_i - (this->oldGeometry).x1.m_i;
      if ((int)uVar16 < (int)uVar10) {
        uVar16 = uVar10;
      }
    }
  }
  uVar10 = uVar11 & 0x20 | uVar1 & 2;
  iVar14 = iVar12;
  if ((uVar10 == 0) &&
     (iVar14 = (iVar7 - (this->oldGeometry).y2.m_i) + (this->mousePressPosition).yp.m_i,
     iVar12 <= iVar14)) {
    iVar14 = iVar12;
  }
LAB_0044ccb2:
  if ((uVar11 & 3) == 0) {
    uVar19._0_4_ = (this_00->data->crect).x1;
    uVar19._4_4_ = (this_00->data->crect).y1;
    local_48.y1.m_i = uVar19._4_4_;
  }
  else {
    iVar17 = uVar16 - (this->mousePressPosition).xp.m_i;
    iVar7 = ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + 1;
    iVar15 = iVar7 - (this->internalMinimumSize).wd.m_i;
    QVar9 = QWidget::maximumSize(this_00);
    iVar12 = 0;
    if ((uVar11 & 1) != 0) {
      iVar12 = iVar17;
      if (iVar17 < 1) {
        if (((uVar11 & 4) != 0) && (iVar12 = iVar7 - QVar9.wd.m_i, iVar12 < iVar17)) {
          iVar12 = iVar17;
        }
      }
      else if (((uVar11 & 4) != 0) && (iVar12 = iVar15, iVar17 < iVar15)) {
        iVar12 = iVar17;
      }
    }
    iVar18 = iVar14 - (this->mousePressPosition).yp.m_i;
    iVar15 = ((this->oldGeometry).y2.m_i - (this->oldGeometry).y1.m_i) + 1;
    iVar17 = iVar15 - (this->internalMinimumSize).ht.m_i;
    QVar9 = QWidget::maximumSize(this_00);
    iVar7 = 0;
    if ((uVar11 & 2) != 0) {
      iVar7 = iVar18;
      if (iVar18 < 1) {
        if (((uVar11 & 8) != 0) && (iVar7 = iVar15 - QVar9.ht.m_i, iVar7 < iVar18)) {
          iVar7 = iVar18;
        }
      }
      else if (((uVar11 & 8) != 0) && (iVar7 = iVar17, iVar18 < iVar17)) {
        iVar7 = iVar18;
      }
    }
    uVar3 = (this->oldGeometry).x1;
    uVar6 = (this->oldGeometry).y1;
    uVar19 = (ulong)(uint)(iVar12 + uVar3);
    local_48.y1.m_i = uVar6 + iVar7;
    uVar10 = extraout_EDX;
  }
  local_48.x1.m_i = (int)uVar19;
  if ((uVar11 & 0xc) == 0) {
    pQVar5 = this_00->data;
    iVar12 = (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i;
    iVar14 = (pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i;
  }
  else {
    iVar7 = uVar16 - (this->mousePressPosition).xp.m_i;
    iVar14 = iVar14 - (this->mousePressPosition).yp.m_i;
    auVar20._0_4_ = -(uint)((uVar11 & 0x20) == 0);
    auVar20._4_4_ = -(uint)((uVar11 & 8) == 0);
    auVar20._8_4_ = -(uint)((uVar11 & 0x10) == 0);
    auVar20._12_4_ = -(uint)((uVar11 & 4) == 0);
    uVar11 = movmskps(uVar10,auVar20);
    iVar12 = -iVar7;
    if ((uVar11 & 4) != 0) {
      iVar12 = iVar7;
    }
    if ((uVar11 & 8) != 0) {
      iVar12 = 0;
    }
    iVar7 = -iVar14;
    if ((uVar11 & 1) != 0) {
      iVar7 = iVar14;
    }
    if ((uVar11 & 2) != 0) {
      iVar7 = 0;
    }
    iVar12 = ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + iVar12;
    iVar14 = (iVar7 + (this->oldGeometry).y2.m_i) - (this->oldGeometry).y1.m_i;
  }
  iVar7 = (this->internalMinimumSize).wd.m_i;
  iVar15 = iVar12 + 1;
  if (iVar12 + 1 <= iVar7) {
    iVar15 = iVar7;
  }
  iVar12 = (this->internalMinimumSize).ht.m_i;
  iVar7 = iVar14 + 1;
  if (iVar14 + 1 <= iVar12) {
    iVar7 = iVar12;
  }
  local_48.x2.m_i = local_48.x1.m_i + -1 + iVar15;
  local_48.y2.m_i = local_48.y1.m_i + iVar7 + -1;
  if (this->isInRubberBandMode == true) {
    QRubberBand::setGeometry(this->rubberBand,&local_48);
  }
  else {
    QWidget::setGeometry(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNewGeometry(const QPoint &pos)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(currentOperation != None);
    Q_ASSERT(parent);

    uint cflags = operationMap.find(currentOperation).value().changeFlags;
    int posX = pos.x();
    int posY = pos.y();

    const bool restrictHorizontal = !q->testOption(QMdiSubWindow::AllowOutsideAreaHorizontally);
    const bool restrictVertical = !q->testOption(QMdiSubWindow::AllowOutsideAreaVertically);

    if (restrictHorizontal || restrictVertical) {
        QRect parentRect = q->parentWidget()->rect();
        if (restrictVertical && (cflags & VResizeReverse || currentOperation == Move)) {
            posY = qMin(qMax(mousePressPosition.y() - oldGeometry.y(), posY),
                        parentRect.height() - BoundaryMargin);
        }
        if (currentOperation == Move) {
            if (restrictHorizontal)
                posX = qMin(qMax(BoundaryMargin, posX), parentRect.width() - BoundaryMargin);
            if (restrictVertical)
                posY = qMin(posY, parentRect.height() - BoundaryMargin);
        } else {
            if (restrictHorizontal) {
                if (cflags & HResizeReverse)
                    posX = qMax(mousePressPosition.x() - oldGeometry.x(), posX);
                else
                    posX = qMin(parentRect.width() - (oldGeometry.x() + oldGeometry.width()
                                                      - mousePressPosition.x()), posX);
            }
            if (restrictVertical && !(cflags & VResizeReverse)) {
                posY = qMin(parentRect.height() - (oldGeometry.y() + oldGeometry.height()
                                                   - mousePressPosition.y()), posY);
            }
        }
    }

    QRect geometry;
    if (cflags & (HMove | VMove)) {
        int dx = getMoveDeltaComponent(cflags, HMove, HResize, posX - mousePressPosition.x(),
                                       oldGeometry.width() - internalMinimumSize.width(),
                                       oldGeometry.width() - q->maximumWidth());
        int dy = getMoveDeltaComponent(cflags, VMove, VResize, posY - mousePressPosition.y(),
                                       oldGeometry.height() - internalMinimumSize.height(),
                                       oldGeometry.height() - q->maximumHeight());
        geometry.setTopLeft(oldGeometry.topLeft() + QPoint(dx, dy));
    } else {
        geometry.setTopLeft(q->geometry().topLeft());
    }

    if (cflags & (HResize | VResize)) {
        int dx = getResizeDeltaComponent(cflags, HResize, HResizeReverse,
                                         posX - mousePressPosition.x());
        int dy = getResizeDeltaComponent(cflags, VResize, VResizeReverse,
                                         posY - mousePressPosition.y());
        geometry.setSize(oldGeometry.size() + QSize(dx, dy));
    } else {
        geometry.setSize(q->geometry().size());
    }

    setNewGeometry(&geometry);
}